

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads.c
# Opt level: O0

int zt_threads_set_cond_callbacks(zt_threads_cond_callbacks *cbs)

{
  long *in_RDI;
  zt_threads_cond_callbacks *t;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    memset(&_zt_threads_cond_cbs,0,0x20);
    local_4 = 0;
  }
  else if ((((*in_RDI == 0) || (in_RDI[1] == 0)) || (in_RDI[2] == 0)) || (in_RDI[3] == 0)) {
    local_4 = -1;
  }
  else {
    _zt_threads_cond_cbs.alloc = (_func_zt_threads_cond_ptr_int *)*in_RDI;
    _zt_threads_cond_cbs.free = (_func_void_zt_threads_cond_ptr *)in_RDI[1];
    _zt_threads_cond_cbs.signal = (_func_int_zt_threads_cond_ptr_int *)in_RDI[2];
    _zt_threads_cond_cbs.wait =
         (_func_int_zt_threads_cond_ptr_zt_threads_mutex_ptr_timeval_ptr *)in_RDI[3];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
zt_threads_set_cond_callbacks(struct zt_threads_cond_callbacks *cbs) {
    struct zt_threads_cond_callbacks *t = &_zt_threads_cond_cbs;

    if (cbs == NULL) {
        memset(t, 0, sizeof(_zt_threads_cond_cbs));
        return 0;
    }

    if (cbs->alloc && cbs->free && cbs->signal && cbs->wait) {
        memcpy(t, cbs, sizeof(_zt_threads_cond_cbs));
        return 0;
    }

    return -1;
}